

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  bool bVar1;
  GLint GVar2;
  iterator this_00;
  size_type sVar3;
  ostream *poVar4;
  mapped_type *ppTVar5;
  pointer ppVar6;
  mapped_type in_RDX;
  string *in_RSI;
  int *in_RDI;
  string *unaff_retaddr;
  Shader *in_stack_00000008;
  GLint maxUnits;
  iterator it;
  int location;
  TransientContextLock lock;
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  *in_stack_ffffffffffffff58;
  mapped_type in_stack_ffffffffffffff60;
  TransientContextLock *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff98;
  GLint GVar7;
  _Self local_40;
  _Self local_38 [3];
  int local_20;
  mapped_type local_18;
  string *local_10;
  
  if (*in_RDI != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffff70);
    local_20 = getUniformLocation(in_stack_00000008,unaff_retaddr);
    if (local_20 != -1) {
      this_00 = std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::find(in_stack_ffffffffffffff58,(key_type_conflict1 *)0x15cb39);
      local_38[0]._M_node = this_00._M_node;
      local_40._M_node =
           (_Base_ptr)
           std::
           map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
           ::end(in_stack_ffffffffffffff58);
      bVar1 = std::operator==(local_38,&local_40);
      if (bVar1) {
        GVar2 = anon_unknown.dwarf_79ada::getMaxTextureUnits();
        GVar7 = GVar2;
        sVar3 = std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::size((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                        *)0x15cb96);
        if (sVar3 + 1 < (ulong)(long)GVar2) {
          ppTVar5 = std::
                    map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                    ::operator[]((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                                  *)this_00._M_node,
                                 (key_type_conflict1 *)CONCAT44(GVar7,in_stack_ffffffffffffff98));
          *ppTVar5 = local_18;
        }
        else {
          poVar4 = err();
          poVar4 = std::operator<<(poVar4,"Impossible to use texture \"");
          poVar4 = std::operator<<(poVar4,local_10);
          poVar4 = std::operator<<(poVar4,"\" for shader: all available texture units are used");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)
                            0x15cc90);
        ppVar6->second = local_18;
        in_stack_ffffffffffffff60 = local_18;
      }
    }
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                GLint maxUnits = getMaxTextureUnits();
                if (m_textures.size() + 1 >= static_cast<std::size_t>(maxUnits))
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}